

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

wchar_t spell_book_count_spells(player *p,object *obj,_func__Bool_player_ptr_wchar_t *tester)

{
  _Bool _Var1;
  class_book_conflict *pcVar2;
  wchar_t wVar3;
  long lVar4;
  long lVar5;
  
  pcVar2 = player_object_to_book(p,obj);
  if (pcVar2 == (class_book_conflict *)0x0) {
    wVar3 = L'\0';
  }
  else {
    lVar5 = 0x20;
    wVar3 = L'\0';
    for (lVar4 = 0; lVar4 < pcVar2->num_spells; lVar4 = lVar4 + 1) {
      _Var1 = (*tester)(p,*(wchar_t *)((long)&pcVar2->spells->name + lVar5));
      wVar3 = wVar3 + (uint)_Var1;
      lVar5 = lVar5 + 0x38;
    }
  }
  return wVar3;
}

Assistant:

int spell_book_count_spells(const struct player *p, const struct object *obj,
		bool (*tester)(const struct player *p, int spell))
{
	const struct class_book *book = player_object_to_book(p, obj);
	int i, n_spells = 0;

	if (!book) {
		return n_spells;
	}

	for (i = 0; i < book->num_spells; i++)
		if (tester(p, book->spells[i].sidx))
			n_spells++;

	return n_spells;
}